

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

void monty_free(MontyContext *mc)

{
  ulong local_18;
  size_t j;
  MontyContext *mc_local;
  
  mp_free(mc->m);
  for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
    mp_free(mc->powers_of_r_mod_m[local_18]);
  }
  mp_free(mc->minus_minv_mod_r);
  mp_free(mc->scratch);
  smemclr(mc,0x48);
  safefree(mc);
  return;
}

Assistant:

void monty_free(MontyContext *mc)
{
    mp_free(mc->m);
    for (size_t j = 0; j < 3; j++)
        mp_free(mc->powers_of_r_mod_m[j]);
    mp_free(mc->minus_minv_mod_r);
    mp_free(mc->scratch);
    smemclr(mc, sizeof(*mc));
    sfree(mc);
}